

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_gamma_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  
  iVar2 = *out_size;
  if (0 < (long)iVar2) {
    puVar3 = in->data;
    lVar7 = 0;
    do {
      sVar10 = in->byte;
      iVar11 = 1;
      uVar5 = in->bit;
      iVar9 = 1;
      do {
        iVar8 = iVar9;
        bVar1 = puVar3[sVar10];
        uVar6 = uVar5 - 1;
        in->bit = uVar6;
        if (uVar5 == 0) {
          in->bit = 7;
          sVar10 = sVar10 + 1;
          in->byte = sVar10;
          uVar6 = 7;
        }
        iVar11 = iVar11 + -1;
        uVar4 = uVar5 & 0x1f;
        uVar5 = uVar6;
        iVar9 = iVar8 + 1;
      } while ((bVar1 >> uVar4 & 1) == 0);
      if (iVar11 == 0) {
        iVar9 = 1;
      }
      else {
        sVar10 = in->byte;
        uVar5 = in->bit;
        iVar9 = 1;
        do {
          iVar9 = (uint)((puVar3[sVar10] >> (uVar5 & 0x1f) & 1) != 0) + iVar9 * 2;
          sVar10 = sVar10 + ((int)uVar5 < 1);
          in->byte = sVar10;
          uVar5 = uVar5 - 1 & 7;
          in->bit = uVar5;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      *(int *)(out + lVar7 * 4) = iVar9 - (c->field_6).huffman.ncodes;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar2);
  }
  return 0;
}

Assistant:

int cram_gamma_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    for (i = 0, n = *out_size; i < n; i++) {
	int nz = 0;
	int val;
	//while (get_bit_MSB(in) == 0) nz++;
	nz = get_zero_bits_MSB(in);
	val = 1;
	while (nz > 0) {
	    //val <<= 1; val |= get_bit_MSB(in);
	    GET_BIT_MSB(in, val);
	    nz--;
	}

	out_i[i] = val - c->gamma.offset;
    }

    return 0;
}